

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationDeviceImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SerializationDeviceImpl::~SerializationDeviceImpl(SerializationDeviceImpl *this)

{
  SerializationDeviceImpl *this_local;
  
  GLSLangUtils::FinalizeGlslang();
  std::array<Diligent::RefCntAutoPtr<Diligent::IRenderDevice>,_8UL>::~array(&this->m_RenderDevices);
  std::vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  ::~vector(&this->m_ResourceBindings);
  MtlProperties::~MtlProperties(&this->m_MtlProps);
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pVkDxCompiler);
  std::unique_ptr<Diligent::IDXCompiler,_std::default_delete<Diligent::IDXCompiler>_>::~unique_ptr
            (&this->m_pDxCompiler);
  RenderDeviceBase<Diligent::SerializationEngineImplTraits>::~RenderDeviceBase
            (&this->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>);
  return;
}

Assistant:

SerializationDeviceImpl::~SerializationDeviceImpl()
{
#if !DILIGENT_NO_GLSLANG
    GLSLangUtils::FinalizeGlslang();
#endif
}